

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O2

void Abc_TruthNpnTest(char *pFileName,int NpnType,int nVarNum,int fDumpRes,int fBinary,int fVerbose)

{
  Abc_TtStore_t *p;
  char *pcVar1;
  
  p = Abc_TtStoreLoad(pFileName,nVarNum);
  if (p != (Abc_TtStore_t *)0x0) {
    Abc_TruthNpnPerform(p,NpnType,fVerbose);
    if (fDumpRes != 0) {
      pcVar1 = "_out.tt";
      if (fBinary == 0) {
        pcVar1 = "_out.txt";
      }
      pcVar1 = Extra_FileNameGenericAppend(pFileName,pcVar1);
      Abc_TtStoreWrite(pcVar1,p,fBinary);
      if (fVerbose != 0) {
        printf("The resulting functions are written into file \"%s\".\n",pcVar1);
      }
    }
    Abc_TtStoreFree(p,nVarNum);
    return;
  }
  return;
}

Assistant:

void Abc_TruthNpnTest( char * pFileName, int NpnType, int nVarNum, int fDumpRes, int fBinary, int fVerbose )
{
    Abc_TtStore_t * p;
    char * pFileNameOut;

    // read info from file
    p = Abc_TtStoreLoad( pFileName, nVarNum );
    if ( p == NULL )
        return;

    // consider functions from the file
    Abc_TruthNpnPerform( p, NpnType, fVerbose );

    // write the result
    if ( fDumpRes )
    {
        if ( fBinary )
            pFileNameOut = Extra_FileNameGenericAppend( pFileName, "_out.tt" );
        else
            pFileNameOut = Extra_FileNameGenericAppend( pFileName, "_out.txt" );
        Abc_TtStoreWrite( pFileNameOut, p, fBinary );
        if ( fVerbose )
            printf( "The resulting functions are written into file \"%s\".\n", pFileNameOut );
    }

    // delete data-structure
    Abc_TtStoreFree( p, nVarNum );
//    printf( "Finished computing canonical forms for functions from file \"%s\".\n", pFileName );
}